

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)2>::Copy<float_const[4]>
          (Serializer<(Diligent::SerializerMode)2> *this,float (*pData) [4],size_t Size)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  size_t Size_local;
  float (*pData_local) [4];
  Serializer<(Diligent::SerializerMode)2> *this_local;
  
  msg.field_2._8_8_ = Size;
  if (this->m_End < this->m_Ptr + Size) {
    FormatString<char[26],char[22]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Ptr + Size <= m_End",(char (*) [22])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Copy",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x15e);
    std::__cxx11::string::~string((string *)local_40);
  }
  this->m_Ptr = this->m_Ptr + msg.field_2._8_8_;
  return true;
}

Assistant:

bool Serializer<SerializerMode::Measure>::Copy(T* pData, size_t Size)
{
    VERIFY_EXPR(m_Ptr + Size <= m_End);
    m_Ptr += Size;
    return true;
}